

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall CharScanner::matchRange(CharScanner *this,int c1,int c2)

{
  int iVar1;
  ScannerException *this_00;
  char *__rhs;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int line_;
  undefined4 in_stack_ffffffffffffff58;
  allocator local_71;
  string local_70 [96];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
  if (local_c <= iVar1) {
    iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
    if (iVar1 <= local_10) {
      (**(code **)(*in_RDI + 0x30))();
      return;
    }
  }
  this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"char out of range: \'",&local_71);
  iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
  __rhs = charName(iVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff58),__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff58),__rhs);
  line_ = (int)((ulong)__rhs >> 0x20);
  RefCount<LexerInputState>::operator->((RefCount<LexerInputState> *)(in_RDI + 0xf));
  ScannerException::ScannerException
            (this_00,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff58),line_);
  __cxa_throw(this_00,&ScannerException::typeinfo,ScannerException::~ScannerException);
}

Assistant:

void CharScanner::matchRange(int c1, int c2)
{
	if (LA(1)<c1 || LA(1)>c2) {
		throw ScannerException(std::string("char out of range: '") + charName(LA(1)) + "'", inputState->line);
	}
	consume();
}